

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int64_t iVar1;
  string sStack_8528;
  string src;
  string path;
  stringstream sstr;
  ostream local_84b8 [376];
  ifstream fin;
  streambuf local_8330 [504];
  Interpreter interpreter;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,argv[1],(allocator<char> *)&interpreter);
  std::ifstream::ifstream(&fin,(string *)&path,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
  std::ostream::operator<<(local_84b8,local_8330);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&sStack_8528,(string *)&src);
  mocker::ir::Interpreter::Interpreter(&interpreter,&sStack_8528);
  std::__cxx11::string::~string((string *)&sStack_8528);
  iVar1 = mocker::ir::Interpreter::run(&interpreter);
  mocker::ir::Interpreter::~Interpreter(&interpreter);
  std::__cxx11::string::~string((string *)&src);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&path);
  return (int)iVar1;
}

Assistant:

int main(int argc, char **argv) {
  std::string path = argv[1];
  std::ifstream fin(path);
  std::stringstream sstr;
  sstr << fin.rdbuf();
  std::string src = sstr.str();

  mocker::ir::Interpreter interpreter(src);
  auto exitcode = interpreter.run();

#ifdef PRINT_EXITCODE
  std::cout << "=============================\nexit: " << exitcode << std::endl;
#else
  return (int)exitcode;
#endif
}